

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O3

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list,int *def_val)

{
  istringstream *piVar1;
  long lVar2;
  const_iterator cVar3;
  long lVar4;
  ostringstream ostr;
  allocator local_1e9;
  istringstream *local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  int *local_1c0;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1b8;
  iterator local_1b0;
  key_type local_1a8 [3];
  ios_base local_138 [264];
  
  local_1b0 = init_list._M_array;
  local_1e8 = (istringstream *)__return_storage_ptr__;
  local_1c0 = def_val;
  if (init_list._M_len != 0) {
    local_1b8 = &this->params_;
    lVar4 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_1e0,*(char **)((long)local_1b0 + lVar4),&local_1e9);
      lVar2 = std::__cxx11::string::find_first_not_of((char)(string *)&local_1e0,0x2d);
      if (lVar2 == -1) {
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_1e0,local_1e0 + local_1d8);
      }
      else {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1e0);
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_1b8->_M_t,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0);
      }
      piVar1 = local_1e8;
      if (&(this->params_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)cVar3._M_node) {
        std::__cxx11::istringstream::istringstream(local_1e8,(string *)(cVar3._M_node + 2),_S_in);
        return (string_stream *)piVar1;
      }
      lVar4 = lVar4 + 8;
    } while (init_list._M_len << 3 != lVar4);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)
   ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) = 0x15;
  std::ostream::operator<<(local_1a8,*local_1c0);
  std::__cxx11::stringbuf::str();
  piVar1 = local_1e8;
  std::__cxx11::istringstream::istringstream(local_1e8,(string *)&local_1e0,_S_in);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return (string_stream *)piVar1;
}

Assistant:

string_stream parser::operator()(std::initializer_list<char const* const> init_list, T&& def_val) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }